

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  ColourImpl *pCVar2;
  bool bVar3;
  long lVar4;
  ColourGuard local_38;
  
  poVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  lVar4 = 0x4f;
  do {
    std::ostream::put((char)poVar1);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  local_38.m_colourImpl = (ColourImpl *)CONCAT71(local_38.m_colourImpl._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
  pCVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  if (pCVar2 != (ColourImpl *)0x0) {
    local_38.m_code = Headers;
    local_38.m_engaged = false;
    local_38.m_colourImpl = pCVar2;
    ColourImpl::ColourGuard::engageImpl
              (&local_38,(this->super_StreamingReporterBase).super_ReporterBase.m_stream);
    bVar3 = local_38.m_engaged;
    pCVar2 = local_38.m_colourImpl;
    printHeaderString(this,_name,0);
    if (bVar3 != false) {
      (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0);
    }
    return;
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]"
               );
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    m_stream << lineOfChars('-') << '\n';
    {
        auto guard = m_colour->guardColour( Colour::Headers ).engage( m_stream );
        printHeaderString(_name);
    }
}